

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool __thiscall
Memory::Recycler::ExplicitFreeInternal<(Memory::ObjectInfoBits)0,SmallAllocationBlockAttributes>
          (Recycler *this,void *buffer,size_t size,size_t sizeCat)

{
  CollectionState CVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  DWORD DVar7;
  DWORD DVar8;
  int iVar9;
  LargeHeapBlock *this_00;
  undefined4 extraout_var;
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this_01;
  LargeHeapBlock *largeHeapBlock;
  undefined8 *in_FS_OFFSET;
  undefined1 auStack_68 [8];
  RecyclerHeapObjectInfo info;
  
  CVar1 = (this->collectionState).value;
  if (CVar1 == CollectionStateExit || (char)((CVar1 & CollectionStateSweep) >> 1) != '\0') {
    return false;
  }
  if (((CVar1 >> 0xd & 1) == 0) &&
     ((CVar1 & (CollectionStatePostSweepRedeferralCallback|CollectionStatePostCollectionCallback))
      == CollectionStateNotCollecting && CVar1 != CollectionStateNotCollecting)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x4ab,
                       "(this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState())"
                       ,
                       "this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState()"
                      );
    if (!bVar4) goto LAB_0027e97f;
    *puVar2 = 0;
  }
  info.m_recycler = (Recycler *)0x0;
  info.m_heapBlock = (HeapBlock *)0x0;
  auStack_68 = (undefined1  [8])0x0;
  info.m_address = (void *)0x0;
  info.field_3._0_1_ = 0;
  bVar4 = FindHeapObject(this,buffer,FindHeapObjectFlags_NoFreeBitVerify,
                         (RecyclerHeapObjectInfo *)auStack_68);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x4b1,
                       "(this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info))",
                       "this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info)");
    if (!bVar4) goto LAB_0027e97f;
    *puVar2 = 0;
  }
  if (info.field_3._0_1_ == '\x01') {
    bVar5 = LargeObjectHeader::GetAttributes((LargeObjectHeader *)info.m_heapBlock,*info.m_address);
  }
  else {
    bVar5 = *(byte *)&(info.m_heapBlock)->_vptr_HeapBlock;
  }
  if ((bVar5 & 0xdf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x4b2,"((info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0)",
                       "(info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0");
    if (!bVar4) goto LAB_0027e97f;
    *puVar2 = 0;
  }
  if (this->mainThreadHandle != (HANDLE)0x0) {
    DVar7 = GetCurrentThreadId();
    DVar8 = GetThreadId(this->mainThreadHandle);
    if (DVar7 != DVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4ba,
                         "(this->mainThreadHandle == 0 || ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle))"
                         ,
                         "this->mainThreadHandle == NULL || ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle)"
                        );
      if (!bVar4) goto LAB_0027e97f;
      *puVar2 = 0;
    }
  }
  info._32_8_ = size;
  if ((((ulong)buffer & 0xf) != 0 || buffer < (void *)0x10000) ||
     (this_00 = (LargeHeapBlock *)HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,buffer),
     this_00 == (LargeHeapBlock *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x4be,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar4) goto LAB_0027e97f;
    *puVar2 = 0;
    this_00 = (LargeHeapBlock *)0x0;
  }
  iVar9 = (*(this_00->super_HeapBlock)._vptr_HeapBlock[5])(this_00);
  if (&this->autoHeap != (HeapInfoManager *)CONCAT44(extraout_var,iVar9)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x4c1,"(heapInfo == heapBlock->GetHeapInfo())",
                       "heapInfo == heapBlock->GetHeapInfo()");
    if (!bVar4) goto LAB_0027e97f;
    *puVar2 = 0;
  }
  bVar4 = this->isPageHeapEnabled;
  if (bVar4 == true) {
    if ((((this->capturePageHeapFreeStack == true) &&
         ((this_00->super_HeapBlock).heapBlockType == LargeBlockType)) &&
        (this_00->pageHeapData != (PageHeapData *)0x0)) &&
       (this_00->pageHeapData->pageHeapMode != PageHeapModeOff)) {
      LargeHeapBlock::CapturePageHeapFreeStack(this_00);
    }
  }
  else {
    SetExplicitFreeBitOnSmallBlock<SmallAllocationBlockAttributes>
              (this,&this_00->super_HeapBlock,sizeCat,buffer,NoBit);
    if ((sizeCat == 0) || (0x300 < sizeCat || (sizeCat & 0xf) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                         ,0x2a5,"(HeapInfo::IsAlignedSmallObjectSize(sizeCat))",
                         "HeapInfo::IsAlignedSmallObjectSize(sizeCat)");
      if (!bVar6) {
LAB_0027e97f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
    this_01 = (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
              HeapInfo::GetBucket<(Memory::ObjectInfoBits)0>(&(this->autoHeap).defaultHeap,sizeCat);
    HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::ExplicitFree
              (this_01,buffer,sizeCat);
    if (8 < (ulong)info._32_8_) {
      iVar9 = -0x36;
      if (this->verifyEnabled == false) {
        iVar9 = 0;
      }
      memset((void *)((long)buffer + 8),iVar9,info._32_8_ - 8);
    }
    if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
      SetTrackerData(this,buffer,&TrackerData::ExplicitFreeListObjectData);
    }
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool Recycler::ExplicitFreeInternal(void* buffer, size_t size, size_t sizeCat)
{
    // If the GC is in sweep state while FreeInternal is called, we might be executing a finalizer
    // which called Free, which would cause a "sweepable" buffer to be free-listed. Don't allow this.
    // Also don't allow freeing while we're shutting down the recycler since finalizers get executed
    // at this stage too
    if (this->IsSweeping() || this->IsExiting())
    {
        return false;
    }

#if ENABLE_CONCURRENT_GC
    // We shouldn't be freeing object when we are running GC in thread
    Assert(this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState());
#else
    Assert(!this->CollectionInProgress() || this->IsAllocatableCallbackState());
#endif

    DebugOnly(RecyclerHeapObjectInfo info);
    Assert(this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info));
    Assert((info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0);          // Only NoBit or LeafBit

    HeapInfo * heapInfo = this->GetHeapInfo<attributes>();
#if DBG || defined(RECYCLER_MEMORY_VERIFY) || defined(RECYCLER_PAGE_HEAP)

    // Either the mainThreadHandle is null (we're not thread bound)
    // or we should be calling this function on the main script thread
    Assert(this->mainThreadHandle == NULL ||
        ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle));

    HeapBlock* heapBlock = this->FindHeapBlock(buffer);

    Assert(heapBlock != nullptr);

#if DBG
    Assert(heapInfo == heapBlock->GetHeapInfo());
#endif

#ifdef RECYCLER_PAGE_HEAP
    if (this->IsPageHeapEnabled())
    {
#ifdef STACK_BACK_TRACE
        if (this->ShouldCapturePageHeapFreeStack())
        {
            if (heapBlock->IsLargeHeapBlock())
            {
                LargeHeapBlock* largeHeapBlock = (LargeHeapBlock*)heapBlock;
                if (largeHeapBlock->InPageHeapMode())
                {
                    largeHeapBlock->CapturePageHeapFreeStack();
                }
            }
        }
#endif

        // Don't do actual explicit free in page heap mode
        return false;
    }
#endif

    SetExplicitFreeBitOnSmallBlock<TBlockAttributes>(heapBlock, sizeCat, buffer, attributes);

#endif

    if (TBlockAttributes::IsMediumBlock)
    {
        heapInfo->FreeMediumObject<attributes>(buffer, sizeCat);
    }
    else
    {
        heapInfo->FreeSmallObject<attributes>(buffer, sizeCat);
    }

    if (size > sizeof(FreeObject) || TBlockAttributes::IsMediumBlock)
    {
        // Do this on the background somehow?
        byte expectedFill = 0;
        size_t fillSize = size - sizeof(FreeObject);

#ifdef RECYCLER_MEMORY_VERIFY
        if (this->VerifyEnabled())
        {
            expectedFill = Recycler::VerifyMemFill;
        }
#endif

        memset(((char*)buffer) + sizeof(FreeObject), expectedFill, fillSize);
    }

#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        this->SetTrackerData(buffer, &TrackerData::ExplicitFreeListObjectData);
    }
#endif

    return true;
}